

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O3

void match_ctx_init(match_ctx *ctx,membuf *inbuf,int max_len,int max_offset,int use_imprecise_rle)

{
  size_t __nmemb;
  byte bVar1;
  ushort uVar2;
  int iVar3;
  byte *pbVar4;
  uchar *puVar5;
  bool bVar6;
  matchp pmVar7;
  int offset;
  int iVar8;
  pre_calc (*papVar9) [1];
  unsigned_short *puVar10;
  unsigned_short *puVar11;
  match_node *pmVar12;
  undefined4 *puVar13;
  uint *puVar14;
  uint *puVar15;
  byte bVar16;
  ushort uVar17;
  long lVar18;
  unsigned_short uVar19;
  ulong uVar20;
  uint uVar21;
  match_node *pmVar22;
  ulong uVar23;
  ulong uVar24;
  byte *pbVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  ulong local_70;
  matchp local_58;
  matchp local_40;
  long local_38;
  
  uVar21 = inbuf->len;
  pbVar4 = (byte *)inbuf->buf;
  __nmemb = (long)(int)uVar21 + 1;
  papVar9 = (pre_calc (*) [1])calloc(__nmemb,0x10);
  ctx->info = papVar9;
  puVar10 = (unsigned_short *)calloc(__nmemb,2);
  ctx->rle = puVar10;
  puVar11 = (unsigned_short *)calloc(__nmemb,2);
  local_70 = (ulong)uVar21;
  ctx->rle_r = puVar11;
  ctx->m_pool[0].chunk_size = 0x10;
  ctx->m_pool[0].chunk = -1;
  ctx->m_pool[0].chunk_pos = 0x1ffff0;
  ctx->m_pool[0].chunk_max = 0x1ffff0;
  ctx->max_offset = max_offset;
  ctx->max_len = max_len;
  ctx->buf = pbVar4;
  ctx->len = uVar21;
  if (1 < (long)(int)uVar21) {
    uVar20 = 1;
    bVar16 = *pbVar4;
    do {
      bVar1 = pbVar4[uVar20];
      if (bVar1 == bVar16) {
        uVar19 = puVar10[uVar20 - 1] + 1;
      }
      else {
        uVar19 = 0;
      }
      puVar10[uVar20] = uVar19;
      uVar20 = uVar20 + 1;
      bVar16 = bVar1;
    } while (local_70 != uVar20);
    if (1 < (int)uVar21) {
      lVar30 = (ulong)(uVar21 - 2) + 1;
      do {
        if (puVar10[lVar30 + -1] < puVar10[lVar30]) {
          uVar19 = puVar11[lVar30] + 1;
        }
        else {
          uVar19 = 0;
        }
        puVar11[lVar30 + -1] = uVar19;
        lVar18 = lVar30 + -1;
        bVar6 = 0 < lVar30;
        lVar30 = lVar18;
      } while (lVar18 != 0 && bVar6);
    }
  }
  local_38 = local_70 * 8 + -8;
  uVar28 = 0;
LAB_0010f800:
  do {
    memset(match_ctx_init::rle_map,0,0x10000);
    if (0 < (int)uVar21) {
      lVar30 = 0;
      uVar26 = 0;
      pmVar22 = (match_node *)0x0;
      pbVar25 = pbVar4;
      do {
        if (((uVar28 == *pbVar25) &&
            ((uVar20 = (ulong)*(ushort *)((long)ctx->rle + lVar30),
             match_ctx_init::rle_map[uVar20] != '\0' ||
             (*(ushort *)((long)ctx->rle_r + lVar30) < 0x11)))) &&
           ((use_imprecise_rle == 0 ||
            ((uVar20 == 0 || (*(short *)((long)ctx->rle_r + lVar30) == 0)))))) {
          pmVar12 = (match_node *)chunkpool_malloc(ctx->m_pool);
          pmVar12->index = uVar26;
          pmVar12->next = (match_node *)0x0;
          match_ctx_init::rle_map[uVar20] = '\x01';
          if (~LOG_FATAL < G_log_level) {
            G_log_log_level = LOG_DUMP;
            log_log_default("0) c = %d, added np idx %d -> %d\n",uVar28,(ulong)uVar26,0);
          }
          if (pmVar22 != (match_node *)0x0) {
            if (~LOG_FATAL < G_log_level) {
              G_log_log_level = LOG_DUMP;
              log_log_default("1) c = %d, pointed np idx %d -> %d\n",uVar28,
                              (ulong)(uint)pmVar22->index,(ulong)uVar26);
            }
            pmVar22->next = pmVar12;
          }
          (&(*ctx->info)[0].single)[lVar30] = pmVar12;
          pmVar22 = pmVar12;
        }
        uVar26 = uVar26 + 1;
        lVar30 = lVar30 + 2;
        pbVar25 = pbVar25 + 1;
      } while (local_70 * 2 != lVar30);
      memset(match_ctx_init::rle_map,0,0x10000);
      if (0 < (int)uVar21) {
        puVar15 = (uint *)0x0;
        lVar30 = local_38;
        lVar18 = local_70 + 1;
        do {
          if (uVar28 == pbVar4[lVar18 + -2]) {
            puVar14 = *(uint **)((long)&(*ctx->info)[0].single + lVar30 * 2);
            if ((((puVar14 == (uint *)0x0) &&
                 (puVar14 = puVar15, (ulong)ctx->rle_r[lVar18 + -2] != 0)) &&
                (match_ctx_init::rle_map[ctx->rle_r[lVar18 + -2]] != '\0')) &&
               (puVar15 != (uint *)0x0)) {
              puVar13 = (undefined4 *)chunkpool_malloc(ctx->m_pool);
              *puVar13 = (int)(lVar18 + -2);
              *(uint **)(puVar13 + 2) = puVar15;
              *(undefined4 **)((long)&(*ctx->info)[0].single + lVar30 * 2) = puVar13;
              if (~LOG_ERROR < G_log_level) {
                G_log_log_level = LOG_DEBUG;
                log_log_default("2) c = %d, added np idx %d -> %d\n",(ulong)uVar28,lVar18 + -2,
                                (ulong)*puVar15);
              }
            }
            puVar15 = puVar14;
            if (ctx->rle_r[lVar18 + -2] == 0) {
              match_ctx_init::rle_map[(ushort)(ctx->rle[lVar18 + -2] + 1)] = '\x01';
            }
          }
          lVar18 = lVar18 + -1;
          lVar30 = lVar30 + -8;
        } while (1 < lVar18);
        uVar28 = uVar28 + 1;
        if (uVar28 == 0x100) {
          if (0 < (int)uVar21) {
            do {
              uVar20 = local_70 - 1;
              puVar5 = ctx->buf;
              if (~LOG_FATAL < G_log_level) {
                G_log_log_level = LOG_DUMP;
                log_log_default("index %d, char \'%c\', rle %d, rle_r %d\n",uVar20 & 0xffffffff,
                                (ulong)puVar5[uVar20],(ulong)ctx->rle[uVar20],
                                (ulong)ctx->rle_r[uVar20]);
              }
              local_58 = (matchp)chunkpool_malloc(ctx->m_pool);
              local_58->offset = 0;
              local_58->len = 1;
              local_58->next = (match *)0x0;
              local_38 = uVar20 * 0x10;
              pmVar22 = ctx->info[uVar20][0].single;
              local_40 = local_58;
              if ((pmVar22 != (match_node *)0x0) &&
                 (pmVar22 = pmVar22->next, pmVar22 != (match_node *)0x0)) {
                while (iVar27 = (int)uVar20, pmVar22->index <= ctx->max_offset + iVar27) {
                  if (~LOG_FATAL < G_log_level) {
                    G_log_log_level = LOG_DUMP;
                    log_log_default("find lengths for index %d to index %d\n",uVar20 & 0xffffffff,
                                    (ulong)(uint)pmVar22->index);
                  }
                  if (local_58->offset == 0) {
                    uVar23 = 0;
                  }
                  else {
                    uVar23 = (ulong)local_58->len;
                  }
                  uVar21 = (uint)uVar23;
                  if (~LOG_FATAL < G_log_level) {
                    G_log_log_level = LOG_DUMP;
                    log_log_default("0) comparing with current best [%d] off %d len %d\n",
                                    uVar20 & 0xffffffff,(ulong)local_58->offset,uVar23);
                  }
                  iVar3 = pmVar22->index;
                  offset = iVar3 - iVar27;
                  if (1 < uVar21) {
                    uVar26 = (int)local_70 - uVar21;
                    uVar28 = uVar21;
                    do {
                      if (puVar5[(int)uVar26] != puVar5[(int)(offset + uVar26)]) goto LAB_0010fd8b;
                      uVar2 = ctx->rle_r[(int)uVar26];
                      uVar17 = ctx->rle_r[(int)(offset + uVar26)];
                      if (uVar2 < uVar17) {
                        uVar17 = uVar2;
                      }
                      uVar29 = (uint)uVar17;
                      if (~LOG_FATAL < G_log_level) {
                        G_log_log_level = LOG_DUMP;
                        log_log_default("1) compared sucesssfully [%d] %d %d\n",uVar20,(ulong)uVar26
                                        ,(ulong)(uVar26 + uVar29));
                      }
                      uVar28 = uVar28 - (uVar29 + 1);
                      uVar26 = uVar26 + uVar29 + 1;
                    } while (1 < (int)uVar28);
                  }
                  if (offset < 0x11) {
                    local_58 = (matchp)chunkpool_malloc(ctx->m_pool);
                    local_58->len = 1;
                    local_58->offset = (unsigned_short)offset;
                    local_58->next = local_40;
                    local_40 = local_58;
                  }
                  uVar26 = iVar27 - uVar21;
                  iVar8 = ctx->max_len;
                  uVar28 = uVar21;
                  if ((-1 < (int)uVar26) && ((int)uVar21 <= iVar8)) {
                    uVar29 = iVar3 - uVar21;
                    uVar23 = (ulong)uVar26;
                    uVar26 = uVar21;
                    while (puVar5[uVar23] == puVar5[(int)uVar29]) {
                      if (~LOG_FATAL < G_log_level) {
                        G_log_log_level = LOG_DUMP;
                        log_log_default("2) compared sucesssfully [%d] %d %d\n",uVar20,
                                        uVar23 & 0xffffffff,(ulong)uVar29);
                        iVar8 = ctx->max_len;
                      }
                      uVar28 = uVar26 + 1;
                      uVar24 = uVar23 - 1;
                      if (((long)uVar23 < 1) ||
                         (uVar29 = uVar29 - 1, bVar6 = iVar8 <= (int)uVar26, uVar23 = uVar24,
                         uVar26 = uVar28, bVar6)) goto LAB_0010fd39;
                    }
                    uVar24 = uVar23 & 0xffffffff;
                    uVar28 = uVar26;
LAB_0010fd39:
                    uVar26 = (uint)uVar24;
                    if (uVar21 < uVar28) {
                      local_58 = match_new(ctx,&local_40,iVar27 - uVar26,offset);
                      iVar8 = ctx->max_len;
                    }
                  }
                  if ((iVar8 < (int)uVar28) || ((int)uVar26 < 0)) break;
LAB_0010fd8b:
                  pmVar22 = pmVar22->next;
                  if (pmVar22 == (match_node *)0x0) break;
                }
              }
              if (~LOG_ERROR < G_log_level) {
                G_log_log_level = LOG_DEBUG;
                log_log_default("adding matches for index %d to cache\n",uVar20 & 0xffffffff);
              }
              pmVar7 = local_40;
              dump_matches(0x1e,local_40);
              *(matchp *)((long)&(*ctx->info)[0].cache + local_38) = pmVar7;
              bVar6 = 1 < (long)local_70;
              local_70 = uVar20;
            } while (bVar6);
          }
          return;
        }
        goto LAB_0010f800;
      }
    }
    uVar28 = uVar28 + 1;
    if (uVar28 == 0x100) {
      return;
    }
  } while( true );
}

Assistant:

void match_ctx_init(match_ctx ctx,         /* IN/OUT */
                    struct membuf *inbuf,  /* IN */
                    int max_len,           /* IN */
                    int max_offset,        /* IN */
                    int use_imprecise_rle) /* IN */
{
    struct match_node *np;

    int buf_len = membuf_memlen(inbuf);
    const unsigned char *buf = membuf_get(inbuf);

    int c, i;
    int val;

    ctx->info = calloc(buf_len + 1, sizeof(*ctx->info));
    ctx->rle = calloc(buf_len + 1, sizeof(*ctx->rle));
    ctx->rle_r = calloc(buf_len + 1, sizeof(*ctx->rle_r));

    chunkpool_init(ctx->m_pool, sizeof(match));

    ctx->max_offset = max_offset;
    ctx->max_len = max_len;

    ctx->buf = buf;
    ctx->len = buf_len;

    val = buf[0];
    for (i = 1; i < buf_len; ++i)
    {
        if (buf[i] == val)
        {
            int len = ctx->rle[i - 1] + 1;
            if(len > 65535)
            {
                len = 0;
            }
            ctx->rle[i] = len;
        } else
        {
            ctx->rle[i] = 0;
        }
        val = buf[i];
    }

    for (i = buf_len - 2; i >= 0; --i)
    {
        if (ctx->rle[i] < ctx->rle[i + 1])
        {
            ctx->rle_r[i] = ctx->rle_r[i + 1] + 1;
        } else
        {
            ctx->rle_r[i] = 0;
        }
    }

    /* add extra nodes to rle sequences */
    for(c = 0; c < 256; ++c)
    {
        static char rle_map[65536];
        struct match_node *prev_np;
        unsigned short int rle_len;

        /* for each possible rle char */
        memset(rle_map, 0, sizeof(rle_map));
        prev_np = NULL;
        for (i = 0; i < buf_len; ++i)
        {
            /* must be the correct char */
            if(buf[i] != c)
            {
                continue;
            }

            rle_len = ctx->rle[i];
            if(!rle_map[rle_len] && ctx->rle_r[i] > 16)
            {
                /* no previous lengths and not our primary length*/
                continue;
            }

            if (use_imprecise_rle &&
                ctx->rle_r[i] != 0 && ctx->rle[i] != 0)
            {
                continue;
            }

            np = chunkpool_malloc(ctx->m_pool);
            np->index = i;
            np->next = NULL;
            rle_map[rle_len] = 1;

            LOG(LOG_DUMP, ("0) c = %d, added np idx %d -> %d\n", c, i, 0));

            /* if we have a previous entry, let's chain it together */
            if(prev_np != NULL)
            {
                LOG(LOG_DUMP, ("1) c = %d, pointed np idx %d -> %d\n",
                                c, prev_np->index, i));
                prev_np->next = np;
            }

            ctx->info[i]->single = np;
            prev_np = np;
        }

        memset(rle_map, 0, sizeof(rle_map));
        prev_np = NULL;
        for (i = buf_len - 1; i >= 0; --i)
        {
            /* must be the correct char */
            if(buf[i] != c)
            {
                continue;
            }

            rle_len = ctx->rle_r[i];
            np = ctx->info[i]->single;
            if(np == NULL)
            {
                if(rle_map[rle_len] && prev_np != NULL && rle_len > 0)
                {
                    np = chunkpool_malloc(ctx->m_pool);
                    np->index = i;
                    np->next = prev_np;
                    ctx->info[i]->single = np;

                    LOG(LOG_DEBUG, ("2) c = %d, added np idx %d -> %d\n",
                                    c, i, prev_np->index));
                }
            }
            else
            {
                prev_np = np;
            }

            if(ctx->rle_r[i] > 0)
            {
                continue;
            }
            rle_len = ctx->rle[i] + 1;
            rle_map[rle_len] = 1;
        }
    }


    for (i = buf_len - 1; i >= 0; --i)
    {
        const_matchp matches;

        /* let's populate the cache */
        matches = matches_calc(ctx, i);

        /* add to cache */
        ctx->info[i]->cache = matches;

    }

}